

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

string * __thiscall
miniros::Connection::getRemoteString_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  ostream *poVar1;
  stringstream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"callerid=[",10);
  getCallerId_abi_cxx11_(&local_1c0,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] address=[",0xb);
  (*((this->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Transport[10])(&local_1e0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Connection::getRemoteString()
{
  std::stringstream ss;
  ss << "callerid=[" << getCallerId() << "] address=[" << transport_->getTransportInfo() << "]";
  return ss.str();
}